

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

int __thiscall Cmd::enableRawMode(Cmd *this,int fd)

{
  int iVar1;
  undefined1 local_58 [8];
  termios raw;
  int fd_local;
  Cmd *this_local;
  
  if ((this->raw_mode_ & 1U) == 0) {
    raw.c_ispeed = fd;
    unique0x1000009c = this;
    iVar1 = isatty(this->in_fd_);
    if (iVar1 == 0) {
      this_local._4_4_ = -0x19;
    }
    else {
      iVar1 = tcgetattr(raw.c_ispeed,(termios *)&this->orig_termios_);
      if (iVar1 == -1) {
        this_local._4_4_ = -0x19;
      }
      else {
        memcpy(local_58,&this->orig_termios_,0x3c);
        local_58._0_4_ = local_58._0_4_ & 0xfffffacd;
        local_58._4_4_ = local_58._4_4_ & 0xfffffffe;
        raw.c_iflag = raw.c_iflag | 0x30;
        raw.c_oflag = raw.c_oflag & 0xffff7ff4;
        raw.c_lflag._3_1_ = 1;
        raw.c_lflag._2_1_ = 0;
        iVar1 = tcsetattr(raw.c_ispeed,2,(termios *)local_58);
        if (iVar1 < 0) {
          this_local._4_4_ = -0x19;
        }
        else {
          this->raw_mode_ = true;
          this_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int enableRawMode(int fd) {

		if (raw_mode_) {
			return 0;
		}

		if (!isatty(in_fd_)) {
			return -ENOTTY;
		}

		if (tcgetattr(fd, &orig_termios_) == -1) {
			return -ENOTTY;
		}

		struct termios raw = orig_termios_; // modify the original mode

		// input modes: no break, no CR to NL, no parity check, no strip char, no start/stop output control.
		raw.c_iflag &= ~(BRKINT | ICRNL | INPCK | ISTRIP | IXON);
		// output modes - disable post processing
		raw.c_oflag &= ~(OPOST);
		// control modes - set 8 bit chars
		raw.c_cflag |= (CS8);
		// local modes - echoing off, canonical off, no extended functions, no signal chars (^Z,^C)
		raw.c_lflag &= ~(ECHO | ICANON | IEXTEN | ISIG);
		// control chars - set return condition: min number of bytes and timer. We want read to return every single byte, without timeout.
		raw.c_cc[VMIN]  = 1;
		raw.c_cc[VTIME] = 0; // 1 byte, no timer

		// put terminal in raw mode after flushing
		if (tcsetattr(fd, TCSAFLUSH, &raw) < 0)
			return -ENOTTY;

		raw_mode_ = true;
		return 0;
	}